

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

code_point
booster::locale::utf::utf_traits<unsigned_short,2>::decode<unsigned_short_const*>
          (unsigned_short **current,unsigned_short *last)

{
  ushort w1_00;
  ushort w2_00;
  ushort *puVar1;
  long in_RSI;
  long *in_RDI;
  uint16_t w2;
  uint16_t w1;
  bool local_1d;
  uint local_4;
  
  if (*in_RDI == in_RSI) {
    local_4 = 0xfffffffe;
  }
  else {
    puVar1 = (ushort *)*in_RDI;
    *in_RDI = (long)(puVar1 + 1);
    w1_00 = *puVar1;
    local_1d = w1_00 < 0xd800 || 0xdfff < w1_00;
    if (local_1d) {
      local_4 = (uint)w1_00;
    }
    else if (w1_00 < 0xdc00) {
      if (*in_RDI == in_RSI) {
        local_4 = 0xfffffffe;
      }
      else {
        puVar1 = (ushort *)*in_RDI;
        *in_RDI = (long)(puVar1 + 1);
        w2_00 = *puVar1;
        if ((w2_00 < 0xdc00) || (0xdfff < w2_00)) {
          local_4 = 0xffffffff;
        }
        else {
          local_4 = utf_traits<unsigned_short,_2>::combine_surrogate(w1_00,w2_00);
        }
      }
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  return local_4;
}

Assistant:

static code_point decode(It &current,It last)
        {
            if(BOOSTER_LOCALE_UNLIKELY(current == last))
                return incomplete;
            uint16_t w1=*current++;
            if(BOOSTER_LOCALE_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
                return w1;
            }
            if(w1 > 0xDBFF)
                return illegal;
            if(current==last)
                return incomplete;
            uint16_t w2=*current++;
            if(w2 < 0xDC00 || 0xDFFF < w2)
                return illegal;
            return combine_surrogate(w1,w2);
        }